

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::areAllChildConst(TIntermediate *this,TIntermAggregate *aggrNode)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppTVar3;
  undefined4 extraout_var_00;
  long lVar4;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_40;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  local_38;
  iterator p;
  TIntermSequence *childSequenceVector;
  bool allConstant;
  TIntermAggregate *aggrNode_local;
  TIntermediate *this_local;
  
  if (aggrNode != (TIntermAggregate *)0x0) {
    iVar2 = (*(aggrNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    p._M_current = (TIntermNode **)CONCAT44(extraout_var,iVar2);
    local_38._M_current =
         (TIntermNode **)
         std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                   ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)p._M_current);
    while( true ) {
      local_40._M_current =
           (TIntermNode **)
           std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end(p._M_current);
      bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
      if (!bVar1) break;
      ppTVar3 = __gnu_cxx::
                __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&local_38);
      iVar2 = (*(*ppTVar3)->_vptr_TIntermNode[3])();
      lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x28))();
      if (lVar4 == 0) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
      ::operator++(&local_38,0);
    }
  }
  return true;
}

Assistant:

bool TIntermediate::areAllChildConst(TIntermAggregate* aggrNode)
{
    bool allConstant = true;

    // check if all the child nodes are constants so that they can be inserted into
    // the parent node
    if (aggrNode) {
        TIntermSequence& childSequenceVector = aggrNode->getSequence();
        for (TIntermSequence::iterator p  = childSequenceVector.begin();
                                       p != childSequenceVector.end(); p++) {
            if (!(*p)->getAsTyped()->getAsConstantUnion())
                return false;
        }
    }

    return allConstant;
}